

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-client.c
# Opt level: O0

void ssh2channel_send_terminal_size_change(SshChannel *sc,int w,int h)

{
  ssh2_connection_state *psVar1;
  PktOut *pPVar2;
  PktOut *pktout;
  ssh2_connection_state *s;
  ssh2_channel *c;
  int h_local;
  int w_local;
  SshChannel *sc_local;
  
  psVar1 = ((ssh2_channel *)(sc + -0xb))->connlayer;
  pPVar2 = ssh2_chanreq_init((ssh2_channel *)(sc + -0xb),"window-change",(cr_handler_fn_t)0x0,
                             (void *)0x0);
  BinarySink_put_uint32(pPVar2->binarysink_,(long)w);
  BinarySink_put_uint32(pPVar2->binarysink_,(long)h);
  BinarySink_put_uint32(pPVar2->binarysink_,0);
  BinarySink_put_uint32(pPVar2->binarysink_,0);
  pq_base_push(&((psVar1->ppl).out_pq)->pqb,&pPVar2->qnode);
  return;
}

Assistant:

void ssh2channel_send_terminal_size_change(SshChannel *sc, int w, int h)
{
    struct ssh2_channel *c = container_of(sc, struct ssh2_channel, sc);
    struct ssh2_connection_state *s = c->connlayer;

    PktOut *pktout = ssh2_chanreq_init(c, "window-change", NULL, NULL);
    put_uint32(pktout, w);
    put_uint32(pktout, h);
    put_uint32(pktout, 0);             /* pixel width */
    put_uint32(pktout, 0);             /* pixel height */
    pq_push(s->ppl.out_pq, pktout);
}